

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O3

int descend(saucy *s,coloring *c,int target,int min)

{
  uint uVar1;
  int iVar2;
  Vec_Int_t *p;
  int *piVar3;
  Vec_Int_t *p_00;
  int *piVar4;
  int *piVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  
  lVar6 = (long)c->clen[target] + (long)target;
  piVar3 = &s->stats->nodes;
  *piVar3 = *piVar3 + 1;
  piVar3 = c->lab;
  piVar4 = c->unlab;
  iVar2 = piVar3[min];
  iVar10 = piVar3[lVar6];
  piVar3[min] = iVar10;
  piVar4[iVar10] = min;
  piVar3[lVar6] = iVar2;
  piVar4[iVar2] = (int)lVar6;
  s->difflev[s->lev] = s->ndiffs;
  s->undifflev[s->lev] = s->nundiffs;
  s->lev = s->lev + 1;
  (*s->split)(s,c,target,(int)lVar6);
  s->adj = s->depAdj;
  s->edg = s->depEdg;
  iVar2 = refine(s,c);
  iVar10 = 0;
  if ((iVar2 != 0) &&
     ((s->fBooleanMatching == 0 ||
      ((iVar2 = check_OPP_for_Boolean_matching(s,c), iVar2 != 0 &&
       ((s->fBooleanMatching == 0 || (iVar2 = check_OPP_for_Boolean_matching(s,c), iVar2 != 0)))))))
     ) {
    if ((s->fLookForSwaps != 0) && (&s->left != c)) {
      p = (Vec_Int_t *)malloc(0x10);
      p->nCap = 0x10;
      p->nSize = 0;
      piVar3 = (int *)malloc(0x40);
      p->pArray = piVar3;
      p_00 = (Vec_Int_t *)malloc(0x10);
      p_00->nCap = 0x10;
      p_00->nSize = 0;
      piVar4 = (int *)malloc(0x40);
      p_00->pArray = piVar4;
      if (0 < s->n) {
        piVar5 = (s->left).clen;
        iVar2 = 0;
        do {
          lVar6 = (long)iVar2;
          uVar8 = 0;
          if (-1 < piVar5[lVar6]) {
            lVar12 = lVar6 + -1;
            do {
              Vec_IntPush(p,(s->left).cfront[(s->right).lab[lVar12 + 1]]);
              Vec_IntPush(p_00,(s->right).cfront[(s->left).lab[lVar12 + 1]]);
              lVar12 = lVar12 + 1;
            } while (lVar12 < (s->left).clen[lVar6] + lVar6);
            uVar8 = p->nSize;
            piVar3 = p->pArray;
          }
          qsort(piVar3,(long)(int)uVar8,4,Vec_IntSortCompareUnsigned);
          uVar11 = p_00->nSize;
          piVar4 = p_00->pArray;
          qsort(piVar4,(long)(int)uVar11,4,Vec_IntSortCompareUnsigned);
          if (0 < (int)uVar8) {
            if ((int)uVar11 < 1) {
              uVar11 = 0;
            }
            uVar7 = 0;
            do {
              if (uVar11 == uVar7) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                              ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
              }
              if (piVar3[uVar7] != piVar4[uVar7]) {
                free(piVar3);
                free(p);
                free(piVar4);
                free(p_00);
                return 0;
              }
              uVar7 = uVar7 + 1;
            } while (uVar8 != uVar7);
          }
          p->nSize = 0;
          p_00->nSize = 0;
          piVar5 = (s->left).clen;
          iVar2 = piVar5[lVar6] + iVar2 + 1;
        } while (iVar2 < s->n);
        piVar3 = p->pArray;
      }
      if (piVar3 != (int *)0x0) {
        free(piVar3);
      }
      free(p);
      if (piVar4 != (int *)0x0) {
        free(piVar4);
      }
      free(p_00);
    }
    if (&s->left != c) {
      lVar6 = (long)s->nsplits;
      while (lVar6 = lVar6 + -1, s->splitlev[(long)s->lev + -1] < lVar6) {
        piVar3 = s->adj;
        lVar9 = (long)c->lab[s->splitwho[lVar6]];
        lVar12 = (long)piVar3[lVar9];
        iVar2 = 0;
        iVar10 = 0;
        uVar8 = 0;
        if (piVar3[lVar9] < piVar3[lVar9 + 1]) {
          uVar8 = 0;
          iVar10 = 0;
          do {
            iVar10 = iVar10 + c->cfront[s->edg[lVar12]];
            uVar8 = uVar8 ^ c->cfront[s->edg[lVar12]];
            lVar12 = lVar12 + 1;
          } while (piVar3[lVar9 + 1] != lVar12);
        }
        piVar4 = (s->left).lab;
        lVar9 = (long)piVar4[s->splitwho[lVar6]];
        lVar12 = (long)piVar3[lVar9];
        uVar11 = 0;
        if (piVar3[lVar9] < piVar3[lVar9 + 1]) {
          uVar11 = 0;
          iVar2 = 0;
          do {
            uVar1 = (s->left).cfront[s->edg[lVar12]];
            iVar2 = iVar2 + uVar1;
            uVar11 = uVar11 ^ uVar1;
            lVar12 = lVar12 + 1;
          } while (piVar3[lVar9 + 1] != lVar12);
        }
        if (iVar10 != iVar2) {
          return 0;
        }
        if (uVar8 != uVar11) {
          return 0;
        }
        lVar12 = (long)c->lab[s->splitfrom[lVar6]];
        lVar9 = (long)piVar3[lVar12];
        iVar2 = 0;
        iVar10 = 0;
        uVar8 = 0;
        if (piVar3[lVar12] < piVar3[lVar12 + 1]) {
          uVar8 = 0;
          iVar10 = 0;
          do {
            iVar10 = iVar10 + c->cfront[s->edg[lVar9]];
            uVar8 = uVar8 ^ c->cfront[s->edg[lVar9]];
            lVar9 = lVar9 + 1;
          } while (piVar3[lVar12 + 1] != lVar9);
        }
        lVar12 = (long)piVar4[s->splitfrom[lVar6]];
        lVar9 = (long)piVar3[lVar12];
        uVar11 = 0;
        if (piVar3[lVar12] < piVar3[lVar12 + 1]) {
          uVar11 = 0;
          iVar2 = 0;
          do {
            uVar1 = (s->left).cfront[s->edg[lVar9]];
            iVar2 = iVar2 + uVar1;
            uVar11 = uVar11 ^ uVar1;
            lVar9 = lVar9 + 1;
          } while (piVar3[lVar12 + 1] != lVar9);
        }
        if (iVar10 != iVar2) {
          return 0;
        }
        if (uVar8 != uVar11) {
          return 0;
        }
      }
    }
    iVar10 = 1;
  }
  return iVar10;
}

Assistant:

static int
descend(struct saucy *s, struct coloring *c, int target, int min)
{
    int back = target + c->clen[target];

    /* Count this node */
    ++s->stats->nodes;

    /* Move the minimum label to the back */
    swap_labels(c, min, back);

    /* Split the cell */
    s->difflev[s->lev] = s->ndiffs;
    s->undifflev[s->lev] = s->nundiffs;
    ++s->lev;
    s->split(s, c, target, back);   

    /* Now go and do some work */
    //print_partition(&s->left, NULL, s->n, s->pNtk, 1);    
    if (!refineByDepGraph(s, c)) return 0;

    /* if we are looking for a Boolean matching, check the OPP and 
     * backtrack if the OPP maps part of one network to itself */
    if (s->fBooleanMatching && !check_OPP_for_Boolean_matching(s, c)) return 0;

    //print_partition(&s->left, NULL, s->n, s->pNtk, 1);
    if (REFINE_BY_SIM_1 && !s->refineBySim1(s, c)) return 0;

    //print_partition(&s->left, NULL, s->n, s->pNtk, 1);
    if (REFINE_BY_SIM_2 && !s->refineBySim2(s, c)) return 0;

    /* do the check once more, maybe the check fails, now that refinement is complete */
    if (s->fBooleanMatching && !check_OPP_for_Boolean_matching(s, c)) return 0;

    if (s->fLookForSwaps && !check_OPP_only_has_swaps(s, c)) return 0;

    if (!double_check_OPP_isomorphism(s, c)) return 0;
    
    return 1;
}